

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simultan.c
# Opt level: O0

void lin_state_term(Item *q1,Item *q2)

{
  Item *in_RSI;
  long in_RDI;
  int dim;
  undefined4 in_stack_ffffffffffffffe8;
  uint in_stack_ffffffffffffffec;
  
  statsym = *(Symbol **)(in_RDI + 8);
  replacstr(in_RSI,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  if ((statsym->subtype & 0x20U) != 0) {
    indexstr = qconcat(q1,q2);
    deltokens(in_RSI,(Item *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    replacstr(in_RSI,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  }
  if (statsym->used == 1) {
    statsym->varnum = nstate;
    if ((statsym->subtype & 0x20U) == 0) {
      sprintf(buf,"_slist%d[%d] = &(%s) - _p;\n",(ulong)(uint)numlist,(ulong)(uint)nstate,
              statsym->name);
      nstate = nstate + 1;
    }
    else {
      in_stack_ffffffffffffffec = statsym->araydim;
      using_array = 1;
      sprintf(buf,"for(_i=0;_i<%d;_i++){_slist%d[%d+_i] = (%s + _i) - _p;}\n",
              (ulong)in_stack_ffffffffffffffec,(ulong)(uint)numlist,(ulong)(uint)nstate,
              statsym->name);
      nstate = in_stack_ffffffffffffffec + nstate;
    }
    lappendstr(in_RSI,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  }
  return;
}

Assistant:

void lin_state_term(q1, q2) /* term last*/
	Item *q1, *q2;
{
	char *qconcat(); /* but puts extra ) at end */
	
	statsym = SYM(q1);
	replacstr(q1, "1.0");
	if (statsym->subtype & ARRAY) { 
		indexstr = qconcat(q1->next->next, q2->prev);
		deltokens(q1->next, q2->prev); /*can't erase lastok*/
		replacstr(q2, "");
	}
	if (statsym->used == 1) {
		statsym->varnum = nstate;
		if (statsym->subtype & ARRAY) {int dim = statsym->araydim;
			using_array=1;
		        Sprintf(buf, "for(_i=0;_i<%d;_i++){_slist%d[%d+_i] = (%s + _i) - _p;}\n"
		                ,dim, numlist , nstate, statsym->name);
			nstate += dim;
		}else{
			Sprintf(buf, "_slist%d[%d] = &(%s) - _p;\n",
				numlist, nstate, statsym->name);
			nstate++;
		}
	        Lappendstr(initlist, buf);
	}
}